

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

RequestHolder * __thiscall
ot::commissioner::coap::Coap::RequestsCache::Match(RequestsCache *this,Response *aResponse)

{
  bool bVar1;
  Type TVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  Endpoint *pEVar5;
  element_type *peVar6;
  Endpoint *pEVar7;
  undefined1 local_50 [8];
  RequestPtr request;
  RequestHolder *requestHolder;
  iterator __end2;
  iterator __begin2;
  multiset<ot::commissioner::coap::Coap::RequestHolder,_std::less<ot::commissioner::coap::Coap::RequestHolder>,_std::allocator<ot::commissioner::coap::Coap::RequestHolder>_>
  *__range2;
  Response *aResponse_local;
  RequestsCache *this_local;
  
  __end2 = std::
           multiset<ot::commissioner::coap::Coap::RequestHolder,_std::less<ot::commissioner::coap::Coap::RequestHolder>,_std::allocator<ot::commissioner::coap::Coap::RequestHolder>_>
           ::begin(&this->mContainer);
  requestHolder =
       (RequestHolder *)
       std::
       multiset<ot::commissioner::coap::Coap::RequestHolder,_std::less<ot::commissioner::coap::Coap::RequestHolder>,_std::allocator<ot::commissioner::coap::Coap::RequestHolder>_>
       ::end(&this->mContainer);
  do {
    bVar1 = std::operator!=(&__end2,(_Self *)&requestHolder);
    if (!bVar1) {
      return (RequestHolder *)0x0;
    }
    request.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::_Rb_tree_const_iterator<ot::commissioner::coap::Coap::RequestHolder>::operator*
                   (&__end2);
    std::shared_ptr<ot::commissioner::coap::Message>::shared_ptr
              ((shared_ptr<ot::commissioner::coap::Message> *)local_50,
               (shared_ptr<ot::commissioner::coap::Message> *)
               request.
               super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    pEVar5 = Message::GetEndpoint(aResponse);
    peVar6 = std::
             __shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_50);
    pEVar7 = Message::GetEndpoint(peVar6);
    if (pEVar5 == pEVar7) {
      TVar2 = Message::GetType(aResponse);
      if (kNonConfirmable < TVar2) {
        if ((byte)(TVar2 - kAcknowledgment) < 2) {
          uVar3 = Message::GetMessageId(aResponse);
          peVar6 = std::
                   __shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_50);
          uVar4 = Message::GetMessageId(peVar6);
          if (uVar3 == uVar4) {
            this_local = (RequestsCache *)
                         request.
                         super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
            bVar1 = true;
            goto LAB_002f0329;
          }
        }
        goto LAB_002f0322;
      }
      peVar6 = std::
               __shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_50);
      bVar1 = Message::IsTokenEqual(aResponse,peVar6);
      if (!bVar1) goto LAB_002f0322;
      this_local = (RequestsCache *)
                   request.
                   super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
      bVar1 = true;
    }
    else {
LAB_002f0322:
      bVar1 = false;
    }
LAB_002f0329:
    std::shared_ptr<ot::commissioner::coap::Message>::~shared_ptr
              ((shared_ptr<ot::commissioner::coap::Message> *)local_50);
    if (bVar1) {
      return (RequestHolder *)this_local;
    }
    std::_Rb_tree_const_iterator<ot::commissioner::coap::Coap::RequestHolder>::operator++(&__end2);
  } while( true );
}

Assistant:

const Coap::RequestHolder *Coap::RequestsCache::Match(const Response &aResponse) const
{
    for (const auto &requestHolder : mContainer)
    {
        const auto request = requestHolder.mRequest;

        if (aResponse.GetEndpoint() == request->GetEndpoint())
        {
            switch (aResponse.GetType())
            {
            case Type::kReset:
            case Type::kAcknowledgment:
                if (aResponse.GetMessageId() == request->GetMessageId())
                {
                    return &requestHolder;
                }
                break;
            case Type::kConfirmable:
            case Type::kNonConfirmable:
                if (aResponse.IsTokenEqual(*request))
                {
                    return &requestHolder;
                }
                break;
            }
        }
    }
    return nullptr;
}